

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OverviewExamples.cpp
# Opt level: O2

Sandwich * createSandwichForTest(void)

{
  Sandwich *in_RDI;
  long lVar1;
  allocator<char> local_83;
  allocator<char> local_82;
  allocator<char> local_81;
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  
  (in_RDI->bread)._M_dataplus._M_p = (pointer)&(in_RDI->bread).field_2;
  (in_RDI->bread)._M_string_length = 0;
  (in_RDI->bread).field_2._M_local_buf[0] = '\0';
  (in_RDI->condiments).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->condiments).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->condiments).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (in_RDI->fillings).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (in_RDI->fillings).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (in_RDI->fillings).contents.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::assign((char *)in_RDI);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"Mayo",&local_81);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"Pepper",&local_82);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Olive Oil",&local_83);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             &in_RDI->condiments,local_80,&stack0xffffffffffffffe0);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string(local_80 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::string<std::allocator<char>>(local_80,"Tomato",&local_81);
  std::__cxx11::string::string<std::allocator<char>>(local_60,"Lettuce",&local_82);
  std::__cxx11::string::string<std::allocator<char>>(local_40,"Cheddar",&local_83);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&in_RDI->fillings,
             local_80,&stack0xffffffffffffffe0);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string(local_80 + lVar1);
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return in_RDI;
}

Assistant:

static Sandwich createSandwichForTest()
{
    Sandwich result;
    result.bread = "Sourdough";
    result.condiments.contents = {"Mayo", "Pepper", "Olive Oil"};
    result.fillings.contents = {"Tomato", "Lettuce", "Cheddar"};
    return result;
}